

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

Node __thiscall xt::vector::pushTail(vector *this,Vector *v,uint level,Node *parent,Node *tailnode)

{
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  _Node *this_00;
  __shared_ptr_access<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var4;
  element_type *peVar5;
  iterator __first;
  iterator __last;
  iterator __result;
  reference pvVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Node NVar7;
  shared_ptr<xt::_Node> local_148;
  Object local_138;
  byte local_111;
  shared_ptr<xt::_Node> local_110;
  byte local_f9;
  shared_ptr<xt::_Node> local_f8;
  byte local_e1;
  shared_ptr<xt::_Node> local_e0;
  byte local_c9;
  shared_ptr<xt::_Vector> local_c8;
  shared_ptr<xt::_Node> local_b8;
  Object local_a8;
  undefined1 local_88 [8];
  Node child;
  Node nodeToInsert;
  uint subidx;
  Node *tailnode_local;
  Node *parent_local;
  uint level_local;
  Vector *v_local;
  Node *ret;
  
  peVar3 = std::__shared_ptr_access<xt::_Vector,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<xt::_Vector,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      v);
  parent_local._4_1_ = (byte)level;
  uVar2 = peVar3->cnt - 1 >> (parent_local._4_1_ & 0x1f) & 0x1f;
  this_00 = (_Node *)operator_new(0x10);
  _Node::_Node(this_00);
  std::shared_ptr<xt::_Node>::shared_ptr<xt::_Node,void>((shared_ptr<xt::_Node> *)this,this_00);
  p_Var4 = (__shared_ptr_access<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)std::__shared_ptr_access<xt::_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<xt::_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                         )parent);
  peVar5 = std::
           __shared_ptr_access<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(p_Var4);
  __first = std::vector<xt::Object,_std::allocator<xt::Object>_>::begin(peVar5);
  p_Var4 = (__shared_ptr_access<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)std::__shared_ptr_access<xt::_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<xt::_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                         )parent);
  peVar5 = std::
           __shared_ptr_access<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(p_Var4);
  __last = std::vector<xt::Object,_std::allocator<xt::Object>_>::end(peVar5);
  p_Var4 = (__shared_ptr_access<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)std::__shared_ptr_access<xt::_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<xt::_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                         )this);
  peVar5 = std::
           __shared_ptr_access<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(p_Var4);
  __result = std::vector<xt::Object,_std::allocator<xt::Object>_>::begin(peVar5);
  std::
  copy<__gnu_cxx::__normal_iterator<xt::Object*,std::vector<xt::Object,std::allocator<xt::Object>>>,__gnu_cxx::__normal_iterator<xt::Object*,std::vector<xt::Object,std::allocator<xt::Object>>>>
            ((__normal_iterator<xt::Object_*,_std::vector<xt::Object,_std::allocator<xt::Object>_>_>
             )__first._M_current,
             (__normal_iterator<xt::Object_*,_std::vector<xt::Object,_std::allocator<xt::Object>_>_>
             )__last._M_current,
             (__normal_iterator<xt::Object_*,_std::vector<xt::Object,_std::allocator<xt::Object>_>_>
             )__result._M_current);
  std::shared_ptr<xt::_Node>::shared_ptr
            ((shared_ptr<xt::_Node> *)
             &child.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (level == 5) {
    std::shared_ptr<xt::_Node>::operator=
              ((shared_ptr<xt::_Node> *)
               &child.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount,tailnode
              );
  }
  else {
    p_Var4 = (__shared_ptr_access<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::__shared_ptr_access<xt::_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<xt::_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)parent);
    peVar5 = std::
             __shared_ptr_access<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*(p_Var4);
    pvVar6 = std::vector<xt::Object,_std::allocator<xt::Object>_>::operator[](peVar5,(ulong)uVar2);
    Object::Object(&local_a8,pvVar6);
    to_node((Object *)local_88);
    Object::~Object(&local_a8);
    bVar1 = std::operator!=((shared_ptr<xt::_Node> *)local_88,(nullptr_t)0x0);
    local_c9 = 0;
    local_e1 = 0;
    local_f9 = 0;
    local_111 = 0;
    if (bVar1) {
      std::shared_ptr<xt::_Vector>::shared_ptr(&local_c8,v);
      local_c9 = 1;
      std::shared_ptr<xt::_Node>::shared_ptr(&local_e0,(shared_ptr<xt::_Node> *)local_88);
      local_e1 = 1;
      std::shared_ptr<xt::_Node>::shared_ptr(&local_f8,tailnode);
      local_f9 = 1;
      pushTail((vector *)&local_b8,&local_c8,level - 5,&local_e0,&local_f8);
    }
    else {
      std::shared_ptr<xt::_Node>::shared_ptr(&local_110,tailnode);
      local_111 = 1;
      newPath((vector *)&local_b8,level - 5,&local_110);
    }
    std::shared_ptr<xt::_Node>::operator=
              ((shared_ptr<xt::_Node> *)
               &child.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &local_b8);
    std::shared_ptr<xt::_Node>::~shared_ptr(&local_b8);
    if ((local_111 & 1) != 0) {
      std::shared_ptr<xt::_Node>::~shared_ptr(&local_110);
    }
    if ((local_f9 & 1) != 0) {
      std::shared_ptr<xt::_Node>::~shared_ptr(&local_f8);
    }
    if ((local_e1 & 1) != 0) {
      std::shared_ptr<xt::_Node>::~shared_ptr(&local_e0);
    }
    if ((local_c9 & 1) != 0) {
      std::shared_ptr<xt::_Vector>::~shared_ptr(&local_c8);
    }
    std::shared_ptr<xt::_Node>::~shared_ptr((shared_ptr<xt::_Node> *)local_88);
  }
  std::shared_ptr<xt::_Node>::shared_ptr
            (&local_148,
             (shared_ptr<xt::_Node> *)
             &child.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Object::Object<xt::_Node>(&local_138,&local_148);
  p_Var4 = (__shared_ptr_access<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)std::__shared_ptr_access<xt::_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<xt::_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                         )this);
  peVar5 = std::
           __shared_ptr_access<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*(p_Var4);
  pvVar6 = std::vector<xt::Object,_std::allocator<xt::Object>_>::operator[](peVar5,(ulong)uVar2);
  Object::operator=(pvVar6,&local_138);
  Object::~Object(&local_138);
  std::shared_ptr<xt::_Node>::~shared_ptr(&local_148);
  std::shared_ptr<xt::_Node>::~shared_ptr
            ((shared_ptr<xt::_Node> *)
             &child.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  NVar7.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  NVar7.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Node)NVar7.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Node pushTail(Vector v, unsigned int level, Node parent, Node tailnode) {
	unsigned int subidx = ((v->cnt -1) >> level) & 0x01f;
	Node ret = Node(new _Node);
	std::copy(parent->array->begin(), parent->array->end(), ret->array->begin());
	Node nodeToInsert;
	if (level == 5)
		nodeToInsert = tailnode;
	else {
		Node child = to_node((*parent->array)[subidx]);
		nodeToInsert = (child != nullptr) ? pushTail(v, level - 5, child, tailnode) : newPath(level - 5, tailnode);
	}
	(*ret->array)[subidx] = nodeToInsert;
	return ret;
}